

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArcSineExpression.cpp
# Opt level: O2

BaseExpressionPtr __thiscall
Kandinsky::ArcSineExpression::derivative(ArcSineExpression *this,VariableExpressionPtr *variable)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *arg1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  BaseExpressionPtr BVar2;
  int local_84;
  shared_ptr<Kandinsky::BaseExpression> local_80;
  Expression local_70;
  Expression local_58;
  UnaryExpression local_40;
  Expression local_28;
  
  p_Var1 = (variable->super___shared_ptr<Kandinsky::VariableExpression,_(__gnu_cxx::_Lock_policy)2>)
           ._M_refcount._M_pi;
  arg1 = &(variable->super___shared_ptr<Kandinsky::VariableExpression,_(__gnu_cxx::_Lock_policy)2>).
          _M_refcount;
  (*p_Var1->_vptr__Sp_counted_base[1])(&local_80,p_Var1);
  local_84 = 1;
  operator*<std::shared_ptr<Kandinsky::BaseExpression>,_std::shared_ptr<Kandinsky::BaseExpression>,_nullptr>
            (&local_70,(shared_ptr<Kandinsky::BaseExpression> *)arg1,
             (shared_ptr<Kandinsky::BaseExpression> *)arg1);
  operator-<int,_Kandinsky::Expression,_nullptr>(&local_58,&local_84,&local_70);
  sqrt<Kandinsky::Expression,_nullptr>((SquareRootExpression *)&local_40,&local_58);
  operator/<std::shared_ptr<Kandinsky::BaseExpression>,_Kandinsky::SquareRootExpression,_nullptr>
            (&local_28,&local_80,(SquareRootExpression *)&local_40);
  BaseExpression::makePtr<Kandinsky::Expression>((BaseExpression *)this,&local_28);
  Expression::~Expression(&local_28);
  UnaryExpression::~UnaryExpression(&local_40);
  Expression::~Expression(&local_58);
  Expression::~Expression(&local_70);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_80.super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  BVar2.super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = extraout_RDX._M_pi;
  BVar2.super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (BaseExpressionPtr)
         BVar2.super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

BaseExpressionPtr ArcSineExpression::derivative(const VariableExpressionPtr& variable) const
    {
        return makePtr(m_arg->derivative(variable) / sqrt(1 - m_arg * m_arg));
    }